

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O0

void __thiscall rst::Parser::ParseLineBlock(Parser *this,BlockType *prev_type,int indent)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int in_EDX;
  char *in_RDI;
  char *line_start;
  bool first;
  string text;
  Parser *in_stack_ffffffffffffff80;
  BlockType *in_stack_ffffffffffffff88;
  long *plVar5;
  Parser *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::string::string(local_38);
  bVar2 = true;
  while ((lVar1 = *(long *)(in_RDI + 8), bVar2 ||
         ((((SkipSpace(in_stack_ffffffffffffff80), **(char **)(in_RDI + 8) == '|' &&
            (bVar2 = anon_unknown.dwarf_4d08c0::IsSpace(*(char *)(*(long *)(in_RDI + 8) + 1)), bVar2
            )) && (*(long *)(in_RDI + 8) - lVar1 == (long)local_14)) &&
          (*(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 2, **(char **)(in_RDI + 8) != '\0'))))) {
    while( true ) {
      bVar2 = false;
      if (**(char **)(in_RDI + 8) != '\0') {
        bVar2 = **(char **)(in_RDI + 8) != '\n';
      }
      if (!bVar2) break;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    }
    if (**(char **)(in_RDI + 8) == '\n') {
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    }
    std::__cxx11::string::append<char_const*,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
    bVar2 = false;
  }
  EnterBlock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (BlockType)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  (**(code **)(**(long **)in_RDI + 0x10))(*(long **)in_RDI,1);
  plVar5 = *(long **)in_RDI;
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  (**(code **)(*plVar5 + 0x20))(plVar5,uVar3,uVar4);
  (**(code **)(**(long **)in_RDI + 0x18))();
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void rst::Parser::ParseLineBlock(rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (*ptr_ != '|' || !IsSpace(ptr_[1]) || ptr_ - line_start != indent)
        break;
      ptr_ += 2;
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;
    if (*ptr_ == '\n')
      ++ptr_;
    text.append(line_start, ptr_);
  }

  EnterBlock(prev_type, rst::LINE_BLOCK);
  handler_->StartBlock(rst::LINE_BLOCK);
  handler_->HandleText(text.c_str(), text.size());
  handler_->EndBlock();
}